

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-logging.cc
# Opt level: O0

Result __thiscall
wabt::BinaryReaderLogging::OnImportMemory
          (BinaryReaderLogging *this,Index import_index,string_view module_name,
          string_view field_name,Index memory_index,Limits *page_limits,uint32_t page_size)

{
  Enum EVar1;
  char local_a8 [8];
  char buf [100];
  Index import_index_local;
  BinaryReaderLogging *this_local;
  string_view field_name_local;
  string_view module_name_local;
  
  buf._92_4_ = import_index;
  unique0x10000098 = this;
  anon_unknown_24::SPrintLimits(local_a8,100,page_limits);
  WriteIndent(this);
  Stream::Writef(this->stream_,"OnImportMemory(import_index: %u, memory_index: %u, %s)\n",
                 (ulong)(uint)buf._92_4_,(ulong)memory_index,local_a8);
  EVar1 = (*this->reader_->_vptr_BinaryReaderDelegate[0x14])
                    (this->reader_,(ulong)(uint)buf._92_4_,module_name._M_len,module_name._M_str,
                     field_name._M_len,field_name._M_str,memory_index,page_limits,page_size);
  return (Result)EVar1;
}

Assistant:

Result BinaryReaderLogging::OnImportMemory(Index import_index,
                                           std::string_view module_name,
                                           std::string_view field_name,
                                           Index memory_index,
                                           const Limits* page_limits,
                                           uint32_t page_size) {
  char buf[100];
  SPrintLimits(buf, sizeof(buf), page_limits);
  LOGF("OnImportMemory(import_index: %" PRIindex ", memory_index: %" PRIindex
       ", %s)\n",
       import_index, memory_index, buf);
  return reader_->OnImportMemory(import_index, module_name, field_name,
                                 memory_index, page_limits, page_size);
}